

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O1

void boost::throw_exception<boost::asio::service_already_exists>(service_already_exists *e)

{
  clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>
  *this;
  undefined **local_58 [2];
  undefined **local_48;
  refcount_ptr<boost::exception_detail::error_info_container> local_40;
  char *pcStack_38;
  char *local_30;
  int local_28;
  
  this = (clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>
          *)__cxa_allocate_exception(0x40);
  std::logic_error::logic_error((logic_error *)local_58,&e->super_logic_error);
  local_40.px_ = (error_info_container *)0x0;
  pcStack_38 = (char *)0x0;
  local_30 = (char *)0x0;
  local_28 = -1;
  local_58[0] = &PTR__error_info_injector_001ce0f0;
  local_48 = &PTR__error_info_injector_001ce118;
  exception_detail::
  clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>::
  clone_impl(this,(error_info_injector<boost::asio::service_already_exists> *)local_58);
  __cxa_throw(this,&exception_detail::
                    clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>>
                    ::typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>
              ::~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}